

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_mesh.cpp
# Opt level: O0

void __thiscall geometrycentral::surface::SurfaceMesh::compressHalfedges(SurfaceMesh *this)

{
  bool bVar1;
  undefined1 uVar2;
  size_type sVar3;
  reference pvVar4;
  SurfaceMesh *in_RDI;
  function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)> *f_1;
  iterator __end3;
  iterator __begin3;
  list<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>,_std::allocator<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>_>_>
  *__range3;
  function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)> *f;
  iterator __end2;
  iterator __begin2;
  list<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>,_std::allocator<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>_>_>
  *__range2;
  size_t iEdge;
  size_t i;
  vector<unsigned_long,_std::allocator<unsigned_long>_> oldIndMap;
  vector<unsigned_long,_std::allocator<unsigned_long>_> newIndEdgeMap;
  vector<unsigned_long,_std::allocator<unsigned_long>_> newIndMap;
  undefined7 in_stack_fffffffffffffdb8;
  undefined1 in_stack_fffffffffffffdbf;
  SurfaceMesh *in_stack_fffffffffffffdc0;
  function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)> *this_00;
  undefined7 in_stack_fffffffffffffdc8;
  undefined1 in_stack_fffffffffffffdcf;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffdd0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffdd8;
  SurfaceMesh *in_stack_fffffffffffffde0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffe10;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *permNewToOld;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffe18;
  vector<char,_std::allocator<char>_> *sourceData;
  _Self local_1a0;
  _Self local_198;
  list<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>,_std::allocator<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>_>_>
  *local_190;
  reference local_188;
  _Self local_180;
  _Self local_178;
  list<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>,_std::allocator<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>_>_>
  *local_170;
  vector<char,_std::allocator<char>_> local_150;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_138;
  undefined1 local_120 [256];
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_20;
  
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x23fb2c);
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x23fb39);
  ::std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x23fb65);
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffde0,
             (size_type)in_stack_fffffffffffffdd8,(value_type_conflict *)in_stack_fffffffffffffdd0,
             (allocator_type *)CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8));
  ::std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x23fb98);
  for (local_120._176_8_ = (_List_node_base *)0x0;
      (ulong)local_120._176_8_ < (_List_node_base *)in_RDI->nHalfedgesFillCount;
      local_120._176_8_ = (long)(_List_node_base **)local_120._176_8_ + 1) {
    bVar1 = halfedgeIsDead(in_stack_fffffffffffffdc0,
                           CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8));
    if (!bVar1) {
      sVar3 = ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&local_20);
      pvVar4 = ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          (local_120 + 0xd0),local_120._176_8_);
      *pvVar4 = sVar3;
      ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffdd0,
                 (value_type_conflict *)
                 CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8));
      bVar1 = usesImplicitTwin(in_RDI);
      if ((bVar1) && ((local_120._176_8_ & 1) == 0)) {
        local_120._168_8_ = (ulong)local_120._176_8_ >> 1;
        ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   in_stack_fffffffffffffdd0,
                   (value_type_conflict *)
                   CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8));
      }
    }
  }
  applyPermutation<unsigned_long,std::allocator<unsigned_long>,std::allocator<unsigned_long>>
            (in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
  sourceData = (vector<char,_std::allocator<char>_> *)(local_120 + 0x90);
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffdd0,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8));
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffdd0);
  applyPermutation<unsigned_long,std::allocator<unsigned_long>,std::allocator<unsigned_long>>
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)sourceData,
             in_stack_fffffffffffffe10);
  permNewToOld = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(local_120 + 0x78);
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffdd0,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8));
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffdd0);
  applyPermutation<unsigned_long,std::allocator<unsigned_long>,std::allocator<unsigned_long>>
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)sourceData,permNewToOld);
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffdd0,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8));
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffdd0);
  bVar1 = usesImplicitTwin(in_RDI);
  if (!bVar1) {
    applyPermutation<unsigned_long,std::allocator<unsigned_long>,std::allocator<unsigned_long>>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)sourceData,permNewToOld);
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffdd0,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8));
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffdd0);
    applyPermutation<unsigned_long,std::allocator<unsigned_long>,std::allocator<unsigned_long>>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)sourceData,permNewToOld);
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffdd0,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8));
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffdd0);
    applyPermutation<char,std::allocator<char>,std::allocator<unsigned_long>>
              (sourceData,permNewToOld);
    ::std::vector<char,_std::allocator<char>_>::operator=
              (in_stack_fffffffffffffdd0,
               (vector<char,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8));
    ::std::vector<char,_std::allocator<char>_>::~vector(in_stack_fffffffffffffdd0);
    applyPermutation<unsigned_long,std::allocator<unsigned_long>,std::allocator<unsigned_long>>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)sourceData,permNewToOld);
    in_stack_fffffffffffffde0 = (SurfaceMesh *)local_120;
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffdd0,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8));
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffdd0);
    applyPermutation<unsigned_long,std::allocator<unsigned_long>,std::allocator<unsigned_long>>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)sourceData,permNewToOld);
    in_stack_fffffffffffffdd8 = &local_138;
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffdd0,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8));
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffdd0);
    applyPermutation<unsigned_long,std::allocator<unsigned_long>,std::allocator<unsigned_long>>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)sourceData,permNewToOld);
    in_stack_fffffffffffffdd0 = &local_150;
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffdd0,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8));
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffdd0);
    applyPermutation<unsigned_long,std::allocator<unsigned_long>,std::allocator<unsigned_long>>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)sourceData,permNewToOld);
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffdd0,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8));
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffdd0);
  }
  this_00 = (function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)> *)
            (local_120 + 0xd0);
  updateValues(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffdd0);
  updateValues(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffdd0);
  updateValues(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffdd0);
  bVar1 = usesImplicitTwin(in_RDI);
  if (!bVar1) {
    updateValues(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffdd0)
    ;
    updateValues(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffdd0)
    ;
    updateValues(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffdd0)
    ;
    updateValues(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffdd0)
    ;
    updateValues(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffdd0)
    ;
    updateValues(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffdd0)
    ;
    updateValues(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffdd0)
    ;
    updateValues(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffdd0)
    ;
  }
  in_RDI->nHalfedgesFillCount = in_RDI->nHalfedgesCount;
  in_RDI->nHalfedgesCapacityCount = in_RDI->nHalfedgesCount;
  local_170 = &in_RDI->halfedgePermuteCallbackList;
  local_178._M_node =
       (_List_node_base *)
       ::std::__cxx11::
       list<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>,_std::allocator<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>_>_>
       ::begin((list<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>,_std::allocator<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>_>_>
                *)CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8));
  local_180._M_node =
       (_List_node_base *)
       ::std::__cxx11::
       list<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>,_std::allocator<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>_>_>
       ::end((list<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>,_std::allocator<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>_>_>
              *)CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8));
  while (bVar1 = ::std::operator!=(&local_178,&local_180), bVar1) {
    local_188 = ::std::
                _List_iterator<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>_>
                ::operator*((_List_iterator<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>_>
                             *)0x240241);
    ::std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>::
    operator()(this_00,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8));
    ::std::
    _List_iterator<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>_>
    ::operator++(&local_178);
  }
  uVar2 = usesImplicitTwin(in_RDI);
  if ((bool)uVar2) {
    in_RDI->nEdgesFillCount = in_RDI->nEdgesCount;
    in_RDI->nEdgesCapacityCount = in_RDI->nEdgesCount;
    local_190 = &in_RDI->edgePermuteCallbackList;
    local_198._M_node =
         (_List_node_base *)
         ::std::__cxx11::
         list<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>,_std::allocator<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>_>_>
         ::begin((list<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>,_std::allocator<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>_>_>
                  *)CONCAT17(uVar2,in_stack_fffffffffffffdb8));
    local_1a0._M_node =
         (_List_node_base *)
         ::std::__cxx11::
         list<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>,_std::allocator<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>_>_>
         ::end((list<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>,_std::allocator<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>_>_>
                *)CONCAT17(uVar2,in_stack_fffffffffffffdb8));
    while (bVar1 = ::std::operator!=(&local_198,&local_1a0), bVar1) {
      ::std::
      _List_iterator<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>_>
      ::operator*((_List_iterator<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>_>
                   *)0x240315);
      ::std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>::
      operator()(this_00,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         CONCAT17(uVar2,in_stack_fffffffffffffdb8));
      ::std::
      _List_iterator<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>_>
      ::operator++(&local_198);
    }
  }
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffdd0);
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffdd0);
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffdd0);
  return;
}

Assistant:

void SurfaceMesh::compressHalfedges() {

  // Build the compressing shift
  std::vector<size_t> newIndMap;                                   // maps new ind -> old ind
  std::vector<size_t> newIndEdgeMap;                               // maps edge new ind -> old ind
  std::vector<size_t> oldIndMap(nHalfedgesFillCount, INVALID_IND); // maps old ind -> new ind
  for (size_t i = 0; i < nHalfedgesFillCount; i++) {
    if (!halfedgeIsDead(i)) {
      oldIndMap[i] = newIndMap.size();
      newIndMap.push_back(i);

      if (usesImplicitTwin() && i % 2 == 0) {
        size_t iEdge = i / 2;
        newIndEdgeMap.push_back(iEdge);
      }
    }
  }

  // Permute & resize all per-halfedge arrays
  heNextArr = applyPermutation(heNextArr, newIndMap);
  heVertexArr = applyPermutation(heVertexArr, newIndMap);
  heFaceArr = applyPermutation(heFaceArr, newIndMap);
  if (!usesImplicitTwin()) {
    heSiblingArr = applyPermutation(heSiblingArr, newIndMap);
    heEdgeArr = applyPermutation(heEdgeArr, newIndMap);
    heOrientArr = applyPermutation(heOrientArr, newIndMap);
    heVertInNextArr = applyPermutation(heVertInNextArr, newIndMap);
    heVertInPrevArr = applyPermutation(heVertInPrevArr, newIndMap);
    heVertOutNextArr = applyPermutation(heVertOutNextArr, newIndMap);
    heVertOutPrevArr = applyPermutation(heVertOutPrevArr, newIndMap);
  }


  // Update indices in all halfedge-valued arrays
  updateValues(vHalfedgeArr, oldIndMap);
  updateValues(fHalfedgeArr, oldIndMap);
  updateValues(heNextArr, oldIndMap);
  if (!usesImplicitTwin()) {
    updateValues(eHalfedgeArr, oldIndMap);
    updateValues(heSiblingArr, oldIndMap);
    updateValues(heVertInNextArr, oldIndMap);
    updateValues(heVertInPrevArr, oldIndMap);
    updateValues(vHeInStartArr, oldIndMap);
    updateValues(heVertOutNextArr, oldIndMap);
    updateValues(heVertOutPrevArr, oldIndMap);
    updateValues(vHeOutStartArr, oldIndMap);
  }

  // Update counts
  nHalfedgesFillCount = nHalfedgesCount;
  nHalfedgesCapacityCount = nHalfedgesCount;

  // Invoke callbacks
  for (auto& f : halfedgePermuteCallbackList) {
    f(newIndMap);
  }

  // In the implicit-twin case, we also need to update edge data here, because they are always in-sync with halfedges
  if (usesImplicitTwin()) {
    nEdgesFillCount = nEdgesCount;
    nEdgesCapacityCount = nEdgesCount;
    // Invoke callbacks
    for (auto& f : edgePermuteCallbackList) {
      f(newIndEdgeMap);
    }
  }
}